

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

CURLcode dict_do(Curl_easy *data,_Bool *done)

{
  int iVar1;
  char *pcVar2;
  int local_64;
  char *pcStack_60;
  int i;
  char *path;
  char *pcStack_50;
  CURLcode result;
  char *nthdef;
  char *strategy;
  char *database;
  char *ppath;
  char *eword;
  char *word;
  _Bool *done_local;
  Curl_easy *data_local;
  
  ppath = (char *)0x0;
  strategy = (char *)0x0;
  nthdef = (char *)0x0;
  pcStack_50 = (char *)0x0;
  *done = true;
  word = done;
  done_local = (_Bool *)data;
  path._4_4_ = Curl_urldecode((data->state).up.path,0,&stack0xffffffffffffffa0,(size_t *)0x0,
                              REJECT_CTRL);
  data_local._4_4_ = path._4_4_;
  if (path._4_4_ == CURLE_OK) {
    iVar1 = curl_strnequal(pcStack_60,"/MATCH:",7);
    if (((iVar1 == 0) && (iVar1 = curl_strnequal(pcStack_60,"/M:",3), iVar1 == 0)) &&
       (iVar1 = curl_strnequal(pcStack_60,"/FIND:",6), iVar1 == 0)) {
      iVar1 = curl_strnequal(pcStack_60,"/DEFINE:",8);
      if (((iVar1 == 0) && (iVar1 = curl_strnequal(pcStack_60,"/D:",3), iVar1 == 0)) &&
         (iVar1 = curl_strnequal(pcStack_60,"/LOOKUP:",8), iVar1 == 0)) {
        database = strchr(pcStack_60,0x2f);
        if (database != (char *)0x0) {
          database = database + 1;
          for (local_64 = 0; database[local_64] != '\0'; local_64 = local_64 + 1) {
            if (database[local_64] == ':') {
              database[local_64] = ' ';
            }
          }
          path._4_4_ = sendf((Curl_easy *)done_local,"CLIENT libcurl 8.10.1-DEV\r\n%s\r\nQUIT\r\n",
                             database);
          if (path._4_4_ == CURLE_OK) {
            Curl_xfer_setup1((Curl_easy *)done_local,1,-1,false);
          }
          else {
            Curl_failf((Curl_easy *)done_local,"Failed sending DICT request");
          }
        }
      }
      else {
        eword = strchr(pcStack_60,0x3a);
        if (eword != (char *)0x0) {
          eword = eword + 1;
          pcVar2 = strchr(eword,0x3a);
          strategy = pcVar2;
          if (pcVar2 != (char *)0x0) {
            strategy = pcVar2 + 1;
            *pcVar2 = '\0';
            pcStack_50 = strchr(strategy,0x3a);
            if (pcStack_50 != (char *)0x0) {
              *pcStack_50 = '\0';
            }
          }
        }
        if ((eword == (char *)0x0) || (*eword == '\0')) {
          if (((done_local != (_Bool *)0x0) && ((*(ulong *)(done_local + 0xa9a) >> 0x1c & 1) != 0))
             && ((*(long *)(done_local + 0x1320) == 0 ||
                 (0 < *(int *)(*(long *)(done_local + 0x1320) + 8))))) {
            Curl_infof((Curl_easy *)done_local,"lookup word is missing");
          }
          eword = "default";
        }
        if ((strategy == (char *)0x0) || (*strategy == '\0')) {
          strategy = "!";
        }
        ppath = unescape_word(eword);
        if (ppath == (char *)0x0) {
          path._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        else {
          path._4_4_ = sendf((Curl_easy *)done_local,
                             "CLIENT libcurl 8.10.1-DEV\r\nDEFINE %s %s\r\nQUIT\r\n",strategy);
          if (path._4_4_ == CURLE_OK) {
            Curl_xfer_setup1((Curl_easy *)done_local,1,-1,false);
          }
          else {
            Curl_failf((Curl_easy *)done_local,"Failed sending DICT request");
          }
        }
      }
    }
    else {
      eword = strchr(pcStack_60,0x3a);
      if (eword != (char *)0x0) {
        eword = eword + 1;
        pcVar2 = strchr(eword,0x3a);
        strategy = pcVar2;
        if (pcVar2 != (char *)0x0) {
          strategy = pcVar2 + 1;
          *pcVar2 = '\0';
          pcVar2 = strchr(strategy,0x3a);
          nthdef = pcVar2;
          if (pcVar2 != (char *)0x0) {
            nthdef = pcVar2 + 1;
            *pcVar2 = '\0';
            pcStack_50 = strchr(nthdef,0x3a);
            if (pcStack_50 != (char *)0x0) {
              *pcStack_50 = '\0';
            }
          }
        }
      }
      if ((eword == (char *)0x0) || (*eword == '\0')) {
        if (((done_local != (_Bool *)0x0) && ((*(ulong *)(done_local + 0xa9a) >> 0x1c & 1) != 0)) &&
           ((*(long *)(done_local + 0x1320) == 0 ||
            (0 < *(int *)(*(long *)(done_local + 0x1320) + 8))))) {
          Curl_infof((Curl_easy *)done_local,"lookup word is missing");
        }
        eword = "default";
      }
      if ((strategy == (char *)0x0) || (*strategy == '\0')) {
        strategy = "!";
      }
      if ((nthdef == (char *)0x0) || (*nthdef == '\0')) {
        nthdef = ".";
      }
      ppath = unescape_word(eword);
      if (ppath == (char *)0x0) {
        path._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        path._4_4_ = sendf((Curl_easy *)done_local,
                           "CLIENT libcurl 8.10.1-DEV\r\nMATCH %s %s %s\r\nQUIT\r\n",strategy,nthdef
                           ,ppath);
        if (path._4_4_ == CURLE_OK) {
          Curl_xfer_setup1((Curl_easy *)done_local,1,-1,false);
        }
        else {
          Curl_failf((Curl_easy *)done_local,"Failed sending DICT request");
        }
      }
    }
    (*Curl_cfree)(ppath);
    (*Curl_cfree)(pcStack_60);
    data_local._4_4_ = path._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode dict_do(struct Curl_easy *data, bool *done)
{
  char *word;
  char *eword = NULL;
  char *ppath;
  char *database = NULL;
  char *strategy = NULL;
  char *nthdef = NULL; /* This is not part of the protocol, but required
                          by RFC 2229 */
  CURLcode result;

  char *path;

  *done = TRUE; /* unconditionally */

  /* url-decode path before further evaluation */
  result = Curl_urldecode(data->state.up.path, 0, &path, NULL, REJECT_CTRL);
  if(result)
    return result;

  if(strncasecompare(path, DICT_MATCH, sizeof(DICT_MATCH)-1) ||
     strncasecompare(path, DICT_MATCH2, sizeof(DICT_MATCH2)-1) ||
     strncasecompare(path, DICT_MATCH3, sizeof(DICT_MATCH3)-1)) {

    word = strchr(path, ':');
    if(word) {
      word++;
      database = strchr(word, ':');
      if(database) {
        *database++ = (char)0;
        strategy = strchr(database, ':');
        if(strategy) {
          *strategy++ = (char)0;
          nthdef = strchr(strategy, ':');
          if(nthdef) {
            *nthdef = (char)0;
          }
        }
      }
    }

    if(!word || (*word == (char)0)) {
      infof(data, "lookup word is missing");
      word = (char *)"default";
    }
    if(!database || (*database == (char)0)) {
      database = (char *)"!";
    }
    if(!strategy || (*strategy == (char)0)) {
      strategy = (char *)".";
    }

    eword = unescape_word(word);
    if(!eword) {
      result = CURLE_OUT_OF_MEMORY;
      goto error;
    }

    result = sendf(data,
                   "CLIENT " LIBCURL_NAME " " LIBCURL_VERSION "\r\n"
                   "MATCH "
                   "%s "    /* database */
                   "%s "    /* strategy */
                   "%s\r\n" /* word */
                   "QUIT\r\n",
                   database,
                   strategy,
                   eword);

    if(result) {
      failf(data, "Failed sending DICT request");
      goto error;
    }
    Curl_xfer_setup1(data, CURL_XFER_RECV, -1, FALSE); /* no upload */
  }
  else if(strncasecompare(path, DICT_DEFINE, sizeof(DICT_DEFINE)-1) ||
          strncasecompare(path, DICT_DEFINE2, sizeof(DICT_DEFINE2)-1) ||
          strncasecompare(path, DICT_DEFINE3, sizeof(DICT_DEFINE3)-1)) {

    word = strchr(path, ':');
    if(word) {
      word++;
      database = strchr(word, ':');
      if(database) {
        *database++ = (char)0;
        nthdef = strchr(database, ':');
        if(nthdef) {
          *nthdef = (char)0;
        }
      }
    }

    if(!word || (*word == (char)0)) {
      infof(data, "lookup word is missing");
      word = (char *)"default";
    }
    if(!database || (*database == (char)0)) {
      database = (char *)"!";
    }

    eword = unescape_word(word);
    if(!eword) {
      result = CURLE_OUT_OF_MEMORY;
      goto error;
    }

    result = sendf(data,
                   "CLIENT " LIBCURL_NAME " " LIBCURL_VERSION "\r\n"
                   "DEFINE "
                   "%s "     /* database */
                   "%s\r\n"  /* word */
                   "QUIT\r\n",
                   database,
                   eword);

    if(result) {
      failf(data, "Failed sending DICT request");
      goto error;
    }
    Curl_xfer_setup1(data, CURL_XFER_RECV, -1, FALSE);
  }
  else {

    ppath = strchr(path, '/');
    if(ppath) {
      int i;

      ppath++;
      for(i = 0; ppath[i]; i++) {
        if(ppath[i] == ':')
          ppath[i] = ' ';
      }
      result = sendf(data,
                     "CLIENT " LIBCURL_NAME " " LIBCURL_VERSION "\r\n"
                     "%s\r\n"
                     "QUIT\r\n", ppath);
      if(result) {
        failf(data, "Failed sending DICT request");
        goto error;
      }

      Curl_xfer_setup1(data, CURL_XFER_RECV, -1, FALSE);
    }
  }

error:
  free(eword);
  free(path);
  return result;
}